

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

fdb_status
filemgr_fetch_header
          (filemgr *file,uint64_t bid,void *buf,size_t *len,fdb_seqnum_t *seqnum,
          filemgr_header_revnum_t *header_revnum,uint64_t *deltasize,uint64_t *version,
          uint64_t *sb_bmp_revnum,err_log_callback *log_callback)

{
  ushort uVar1;
  ulong uVar2;
  bool bVar3;
  fdb_status status;
  void *buf_00;
  ulong uVar4;
  ulong uVar5;
  
  *len = 0;
  status = FDB_RESULT_SUCCESS;
  if (1 < bid + 1) {
    buf_00 = _filemgr_get_temp_buf();
    status = filemgr_read(file,bid,buf_00,log_callback,true);
    if (status == FDB_RESULT_SUCCESS) {
      if (*(char *)((long)buf_00 + ((ulong)file->blocksize - 1)) == -0x12) {
        uVar5 = *(ulong *)((long)buf_00 + ((ulong)file->blocksize - 9));
        uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
                uVar5 << 0x38;
        bVar3 = ver_is_valid_magic(uVar5);
        if (bVar3) {
          uVar1 = *(ushort *)((long)buf_00 + ((ulong)file->blocksize - 0xb));
          uVar4 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
          memcpy(buf,buf_00,uVar4);
          *len = uVar4;
          *version = uVar5;
          if (header_revnum != (filemgr_header_revnum_t *)0x0) {
            uVar2 = *(ulong *)((long)buf_00 + uVar4);
            *header_revnum =
                 uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                 (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                 (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                 uVar2 << 0x38;
          }
          if (seqnum != (fdb_seqnum_t *)0x0) {
            uVar4 = *(ulong *)((long)buf_00 + uVar4 + 8);
            *seqnum = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                      (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                      (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                      (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
          }
          bVar3 = ver_is_atleast_magic_001(uVar5);
          if ((deltasize != (uint64_t *)0x0) && (bVar3)) {
            uVar4 = *(ulong *)((long)buf_00 + ((ulong)file->blocksize - 0x1b));
            *deltasize = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                         (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                         (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
          }
          status = FDB_RESULT_SUCCESS;
          if (sb_bmp_revnum != (uint64_t *)0x0) {
            bVar3 = ver_superblock_support(uVar5);
            status = FDB_RESULT_SUCCESS;
            if (bVar3) {
              uVar5 = *(ulong *)((long)buf_00 + ((ulong)file->blocksize - 0x23));
              *sb_bmp_revnum =
                   uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                   (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                   (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                   | uVar5 << 0x38;
            }
          }
        }
        else {
          status = FDB_RESULT_FILE_CORRUPTION;
          fdb_log_impl(log_callback,3,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,"filemgr_fetch_header",0x4d0,
                       "A block magic value of %lu in the database header blockid %lu in a database file \'%s\'does NOT match FILEMGR_MAGIC %lu!"
                       ,uVar5,bid,file->filename,0xdeadcafebeefc002);
        }
        _filemgr_release_temp_buf(buf_00);
      }
      else {
        _filemgr_release_temp_buf(buf_00);
        status = FDB_RESULT_READ_FAIL;
      }
    }
    else {
      fdb_log_impl(log_callback,3,status,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_fetch_header",0x4b3,
                   "Failed to read a database header with block id %lu in a database file \'%s\'",
                   bid,file->filename);
      _filemgr_release_temp_buf(buf_00);
    }
  }
  return status;
}

Assistant:

fdb_status filemgr_fetch_header(struct filemgr *file, uint64_t bid,
                                void *buf, size_t *len, fdb_seqnum_t *seqnum,
                                filemgr_header_revnum_t *header_revnum,
                                uint64_t *deltasize, uint64_t *version,
                                uint64_t *sb_bmp_revnum,
                                err_log_callback *log_callback)
{
    uint8_t *_buf;
    uint8_t marker[BLK_MARKER_SIZE];
    filemgr_header_len_t hdr_len;
    uint64_t _deltasize, _bmp_revnum;
    filemgr_magic_t magic;
    fdb_status status = FDB_RESULT_SUCCESS;

    *len = 0;

    if (!bid || bid == BLK_NOT_FOUND) {
        // No other header available
        return FDB_RESULT_SUCCESS;
    }

    _buf = (uint8_t *)_filemgr_get_temp_buf();

    status = filemgr_read(file, (bid_t)bid, _buf, log_callback, true);

    if (status != FDB_RESULT_SUCCESS) {
        fdb_log(log_callback, FDB_LOG_WARNING, status,
                "Failed to read a database header with block id %" _F64 " in "
                "a database file '%s'", bid, file->filename);
        _filemgr_release_temp_buf(_buf);
        return status;
    }
    memcpy(marker, _buf + file->blocksize - BLK_MARKER_SIZE,
            BLK_MARKER_SIZE);

    if (marker[0] != BLK_MARKER_DBHEADER) {
        // Comment this warning log as of now because the circular block reuse
        // can cause false alarms as a previous stale header block can be reclaimed
        // and reused for incoming writes.
        /*
        fdb_log(log_callback, FDB_RESULT_FILE_CORRUPTION,
                "A block marker of the database header block id %" _F64 " in "
                "a database file '%s' does NOT match BLK_MARKER_DBHEADER!",
                bid, file->filename);
        */
        _filemgr_release_temp_buf(_buf);
        return FDB_RESULT_READ_FAIL;
    }
    memcpy(&magic,
            _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic),
            sizeof(magic));
    magic = _endian_decode(magic);
    if (!ver_is_valid_magic(magic)) {
        fdb_log(log_callback, FDB_LOG_WARNING, FDB_RESULT_FILE_CORRUPTION,
                "A block magic value of %" _F64 " in the database header block"
                "id %" _F64 " in a database file '%s'"
                "does NOT match FILEMGR_MAGIC %" _F64 "!",
                magic, bid, file->filename, ver_get_latest_magic());
        _filemgr_release_temp_buf(_buf);
        return FDB_RESULT_FILE_CORRUPTION;
    }
    memcpy(&hdr_len,
            _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic) -
            sizeof(hdr_len), sizeof(hdr_len));
    hdr_len = _endian_decode(hdr_len);

    memcpy(buf, _buf, hdr_len);
    *len = hdr_len;
    *version = magic;

    if (header_revnum) {
        // copy the DB header revnum
        filemgr_header_revnum_t _revnum;
        memcpy(&_revnum, _buf + hdr_len, sizeof(_revnum));
        *header_revnum = _endian_decode(_revnum);
    }
    if (seqnum) {
        // copy default KVS's seqnum
        fdb_seqnum_t _seqnum;
        memcpy(&_seqnum, _buf + hdr_len + sizeof(filemgr_header_revnum_t),
               sizeof(_seqnum));
        *seqnum = _endian_decode(_seqnum);
    }

    if (ver_is_atleast_magic_001(magic)) {
        if (deltasize) {
            memcpy(&_deltasize, _buf + file->blocksize - BLK_MARKER_SIZE
                    - sizeof(magic) - sizeof(hdr_len) - sizeof(bid)
                    - sizeof(_deltasize), sizeof(_deltasize));
            *deltasize = _endian_decode(_deltasize);
        }
    }

    if (sb_bmp_revnum && ver_superblock_support(magic)) {
        memcpy(&_bmp_revnum, _buf + file->blocksize - BLK_MARKER_SIZE
                - sizeof(magic) - sizeof(hdr_len) - sizeof(bid)
                - sizeof(_deltasize) - sizeof(_bmp_revnum), sizeof(_bmp_revnum));
        *sb_bmp_revnum = _endian_decode(_bmp_revnum);
    }

    _filemgr_release_temp_buf(_buf);

    return status;
}